

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O3

bool __thiscall wasm::IString::startsWith<6>(IString *this,char (*str) [6])

{
  bool bVar1;
  int iVar2;
  size_t __n;
  
  __n = strlen(*str);
  if (((this->str)._M_len < __n) ||
     ((__n != 0 && (iVar2 = bcmp((this->str)._M_str,str,__n), iVar2 != 0)))) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool startsWith(const char (&str)[N]) {
    return startsWith(std::string_view(str));
  }